

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_hkdf_extract(ptls_hash_algorithm_t *algo,void *output,ptls_iovec_t salt,ptls_iovec_t ikm)

{
  ptls_hash_context_t *ppVar1;
  ptls_iovec_t pVar2;
  uint8_t *local_58;
  uint8_t *local_50;
  ptls_hash_context_t *hash;
  void *output_local;
  ptls_hash_algorithm_t *algo_local;
  ptls_iovec_t ikm_local;
  ptls_iovec_t salt_local;
  
  salt_local.base = (uint8_t *)salt.len;
  ikm_local.len = (size_t)salt.base;
  if (salt_local.base == (uint8_t *)0x0) {
    pVar2 = ptls_iovec_init(zeroes_of_max_digest_size,algo->digest_size);
    local_58 = pVar2.base;
    ikm_local.len = (size_t)local_58;
    local_50 = (uint8_t *)pVar2.len;
    salt_local.base = local_50;
  }
  ppVar1 = ptls_hmac_create(algo,(void *)ikm_local.len,(size_t)salt_local.base);
  if (ppVar1 == (ptls_hash_context_t *)0x0) {
    salt_local.len._4_4_ = 0x201;
  }
  else {
    (*ppVar1->update)(ppVar1,ikm.base,ikm.len);
    (*ppVar1->final)(ppVar1,output,PTLS_HASH_FINAL_MODE_FREE);
    salt_local.len._4_4_ = 0;
  }
  return salt_local.len._4_4_;
}

Assistant:

int ptls_hkdf_extract(ptls_hash_algorithm_t *algo, void *output, ptls_iovec_t salt, ptls_iovec_t ikm)
{
    ptls_hash_context_t *hash;

    if (salt.len == 0)
        salt = ptls_iovec_init(zeroes_of_max_digest_size, algo->digest_size);

    if ((hash = ptls_hmac_create(algo, salt.base, salt.len)) == NULL)
        return PTLS_ERROR_NO_MEMORY;
    hash->update(hash, ikm.base, ikm.len);
    hash->final(hash, output, PTLS_HASH_FINAL_MODE_FREE);
    return 0;
}